

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O2

uint stbiw__crc32(uchar *buffer,int len)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  bool bVar5;
  
  if (stbiw__crc32::crc_table[1] == 0) {
    for (uVar2 = 0; uVar2 != 0x100; uVar2 = uVar2 + 1) {
      iVar4 = 8;
      uVar3 = uVar2 & 0xffffffff;
      while( true ) {
        bVar5 = iVar4 == 0;
        iVar4 = iVar4 + -1;
        if (bVar5) break;
        uVar3 = (ulong)(-((uint)uVar3 & 1) & 0xedb88320 ^ (uint)(uVar3 >> 1));
      }
      stbiw__crc32::crc_table[uVar2] = (uint)uVar3;
    }
  }
  uVar3 = 0;
  uVar2 = (ulong)(uint)len;
  if (len < 1) {
    uVar2 = uVar3;
  }
  uVar1 = 0xffffffff;
  for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    uVar1 = uVar1 >> 8 ^ stbiw__crc32::crc_table[uVar1 & 0xff ^ (uint)buffer[uVar3]];
  }
  return ~uVar1;
}

Assistant:

unsigned int stbiw__crc32(unsigned char *buffer, int len)
{
   static unsigned int crc_table[256];
   unsigned int crc = ~0u;
   int i,j;
   if (crc_table[1] == 0)
      for(i=0; i < 256; i++)
         for (crc_table[i]=i, j=0; j < 8; ++j)
            crc_table[i] = (crc_table[i] >> 1) ^ (crc_table[i] & 1 ? 0xedb88320 : 0);
   for (i=0; i < len; ++i)
      crc = (crc >> 8) ^ crc_table[buffer[i] ^ (crc & 0xff)];
   return ~crc;
}